

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  cmTarget *pcVar5;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  size_type sVar6;
  PolicyID id;
  char *pcVar7;
  char *pcVar8;
  pointer pbVar9;
  uint uVar10;
  MessageType t;
  string local_1f0;
  allocator local_1c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  string prop;
  
  pcVar5 = this->Target;
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      pcVar5->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&prop,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator *)&local_1f0);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&prop);
    std::__cxx11::string::~string((string *)&prop);
    return false;
  }
  uVar10 = this->CurrentProcessingState - ProcessingKeywordLinkInterface;
  cmMakefile::GetExecutionContext((cmListFileContext *)&prop,(this->super_cmCommand).Makefile);
  bVar2 = cmTarget::PushTLLCommandTrace(pcVar5,(uint)(4 < uVar10),(cmListFileContext *)&prop);
  cmListFileContext::~cmListFileContext((cmListFileContext *)&prop);
  if (bVar2) goto LAB_00354399;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop);
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
  if (PVar3 - NEW < 3) {
    t = FATAL_ERROR;
    pcVar8 = "must";
    bVar2 = true;
LAB_003542bf:
    poVar4 = std::operator<<((ostream *)&prop,"The ");
    pcVar7 = "keyword";
    if (uVar10 < 5) {
      pcVar7 = "plain";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,
                             " signature for target_link_libraries has already been used with the target \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)&this->Target->Name);
    poVar4 = std::operator<<(poVar4,"\".  All uses of target_link_libraries with a target ");
    poVar4 = std::operator<<(poVar4,pcVar8);
    std::operator<<(poVar4," be either all-keyword or all-plain.\n");
    cmTarget::GetTllSignatureTraces(this->Target,(ostream *)&prop,(uint)(uVar10 < 5));
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,t,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (bVar2) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
      return false;
    }
  }
  else if (PVar3 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x17,id);
    poVar4 = std::operator<<((ostream *)&prop,(string *)&local_1f0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_1f0);
    pcVar8 = "should";
    bVar2 = false;
    t = AUTHOR_WARNING;
    goto LAB_003542bf;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
LAB_00354399:
  if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
    pcVar5 = cmMakefile::FindLocalNonAliasTarget
                       ((this->super_cmCommand).Makefile,&this->Target->Name);
    if (pcVar5 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop);
      poVar4 = std::operator<<((ostream *)&prop,"Attempt to add link library \"");
      poVar4 = std::operator<<(poVar4,(string *)lib);
      poVar4 = std::operator<<(poVar4,"\" to target \"");
      poVar4 = std::operator<<(poVar4,(string *)&this->Target->Name);
      std::operator<<(poVar4,"\" which is not built in this directory.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
    }
    else {
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar5 = cmGlobalGenerator::FindTarget(this_00,lib,false);
      if ((pcVar5 != (cmTarget *)0x0) &&
         (((INTERFACE_LIBRARY < pcVar5->TargetTypeValue ||
           ((0x86U >> (pcVar5->TargetTypeValue & 0x1f) & 1) == 0)) &&
          (bVar2 = cmTarget::IsExecutableWithExports(pcVar5), !bVar2)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop);
        poVar4 = std::operator<<((ostream *)&prop,"Target \"");
        poVar4 = std::operator<<(poVar4,(string *)lib);
        poVar4 = std::operator<<(poVar4,"\" of type ");
        pcVar8 = cmState::GetTargetTypeName(pcVar5->TargetTypeValue);
        poVar4 = std::operator<<(poVar4,pcVar8);
        poVar4 = std::operator<<(poVar4," may not be linked into another target.  ");
        poVar4 = std::operator<<(poVar4,"One may link only to STATIC or SHARED libraries, or ");
        std::operator<<(poVar4,"to executables with the ENABLE_EXPORTS property set.");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
      }
      cmTarget::AddLinkLibrary(this->Target,(this->super_cmCommand).Makefile,lib,llt);
    }
    if (1 < this->CurrentProcessingState - ProcessingPlainPublicInterface) {
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        pcVar5 = this->Target;
        std::__cxx11::string::string
                  ((string *)&prop,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
        cmTarget::GetDebugGeneratorExpressions(&local_1f0,this->Target,lib,llt);
        cmTarget::AppendProperty(pcVar5,&prop,local_1f0._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&prop);
        return true;
      }
      if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
        return true;
      }
      cmTarget::GetDebugGeneratorExpressions(&prop,this->Target,lib,llt);
      bVar2 = cmGeneratorExpression::IsValidTargetName(lib);
      if ((bVar2) || (sVar6 = cmGeneratorExpression::Find(lib), sVar6 != 0xffffffffffffffff)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,"$<LINK_ONLY:",&prop);
        std::operator+(&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,">");
        std::__cxx11::string::operator=((string *)&prop,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&debugConfigs);
      }
      pcVar5 = this->Target;
      std::__cxx11::string::string
                ((string *)&local_1f0,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
      cmTarget::AppendProperty(pcVar5,&local_1f0,prop._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&prop);
      return true;
    }
  }
  pcVar5 = this->Target;
  std::__cxx11::string::string
            ((string *)&prop,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
  cmTarget::GetDebugGeneratorExpressions(&local_1f0,this->Target,lib,llt);
  cmTarget::AppendProperty(pcVar5,&prop,local_1f0._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&prop);
  PVar3 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if ((PVar3 < NEW) && (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
    this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,this_01);
    prop._M_dataplus._M_p = (pointer)&prop.field_2;
    prop._M_string_length = 0;
    prop.field_2._M_local_buf[0] = '\0';
    if (llt < OPTIMIZED_LibraryType) {
      for (pbVar9 = debugConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 != debugConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        std::__cxx11::string::assign((char *)&prop);
        std::__cxx11::string::append((string *)&prop);
        cmTarget::AppendProperty(this->Target,&prop,(lib->_M_dataplus)._M_p,false);
      }
    }
    if ((llt & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
      pcVar5 = this->Target;
      std::__cxx11::string::string((string *)&local_1f0,"LINK_INTERFACE_LIBRARIES",&local_1c9);
      cmTarget::AppendProperty(pcVar5,&local_1f0,(lib->_M_dataplus)._M_p,false);
      std::__cxx11::string::~string((string *)&local_1f0);
      for (pbVar9 = debugConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 != debugConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        std::__cxx11::string::assign((char *)&prop);
        std::__cxx11::string::append((string *)&prop);
        pcVar8 = cmTarget::GetProperty(this->Target,&prop);
        if (pcVar8 == (char *)0x0) {
          cmTarget::SetProperty(this->Target,&prop,"");
        }
      }
    }
    std::__cxx11::string::~string((string *)&prop);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugConfigs);
  }
  return true;
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = CM_NULLPTR;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig << " signature for target_link_libraries "
                                    "has already been used with the target \""
        << this->Target->GetName() << "\".  All uses of "
                                      "target_link_libraries with a target "
        << modal << " be either "
                    "all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case first.
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    cmTarget* t =
      this->Makefile->FindLocalNonAliasTarget(this->Target->GetName());
    if (!t) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    } else {

      cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

      if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
          !tgt->IsExecutableWithExports()) {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmState::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }

      this->Target->AddLinkLibrary(*this->Makefile, lib, llt);
    }

    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      this->Target->AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
    }
    if (this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
        this->CurrentProcessingState != ProcessingPlainPublicInterface) {
      if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        std::string configLib =
          this->Target->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib) ||
            cmGeneratorExpression::Find(lib) != std::string::npos) {
          configLib = "$<LINK_ONLY:" + configLib + ">";
        }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
      }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
    }
  }

  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }

  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the DEBUG configuration interfaces.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
    }
  }
  if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if (!this->Target->GetProperty(prop)) {
        this->Target->SetProperty(prop, "");
      }
    }
  }
  return true;
}